

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authprogs_test_driver.c
# Opt level: O3

char * lowercase(char *string)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  __int32_t **pp_Var3;
  char cVar4;
  
  sVar2 = strlen(string);
  __dest = (char *)malloc(sVar2 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,string);
    cVar4 = *__dest;
    if (cVar4 != '\0') {
      pp_Var3 = __ctype_tolower_loc();
      pcVar1 = __dest;
      do {
        *pcVar1 = (char)(*pp_Var3)[cVar4];
        cVar4 = pcVar1[1];
        pcVar1 = pcVar1 + 1;
      } while (cVar4 != '\0');
    }
  }
  return __dest;
}

Assistant:

static char* lowercase(const char* string)
{
  char *new_string;
  char *p;
  size_t stringSize;

  stringSize = CM_CAST(size_t, strlen(string) + 1);
  new_string = CM_CAST(char*, malloc(sizeof(char) * stringSize));

  if (new_string == CM_NULL) { /* NOLINT */
    return CM_NULL;            /* NOLINT */
  }
  strcpy(new_string, string);  /* NOLINT */
  for (p = new_string; *p != 0; ++p) {
    *p = CM_CAST(char, tolower(*p));
  }
  return new_string;
}